

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

void __thiscall
cmCPackGenerator::StoreOption<cmValue>(cmCPackGenerator *this,string *op,cmValue value)

{
  cmCPackLog *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  char *msg;
  string local_1d0 [32];
  cmCPackGenerator *local_1b0;
  undefined1 local_198 [8];
  ostringstream cmCPackLog_msg;
  string *op_local;
  cmCPackGenerator *this_local;
  cmValue value_local;
  
  this_local = (cmCPackGenerator *)value.Value;
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    iVar2 = (**this->_vptr_cmCPackGenerator)();
    poVar3 = std::operator<<((ostream *)local_198,(char *)CONCAT44(extraout_var,iVar2));
    poVar3 = std::operator<<(poVar3,"::SetOption(");
    poVar3 = std::operator<<(poVar3,(string *)op);
    poVar3 = std::operator<<(poVar3,", ");
    local_1b0 = this_local;
    poVar3 = ::operator<<(poVar3,(cmValue)this_local);
    poVar3 = std::operator<<(poVar3,")");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_00 = this->Logger;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(this_00,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x3fe,msg);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    cmMakefile::AddDefinition(this->MakefileMap,op,(cmValue)this_local);
  }
  else {
    cmMakefile::RemoveDefinition(this->MakefileMap,op);
  }
  return;
}

Assistant:

void cmCPackGenerator::StoreOption(const std::string& op, ValueType value)
{
  if (!value) {
    this->MakefileMap->RemoveDefinition(op);
    return;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                this->GetNameOfClass() << "::SetOption(" << op << ", " << value
                                       << ")" << std::endl);
  this->MakefileMap->AddDefinition(op, value);
}